

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O3

size_t __thiscall remote::Handle::GetModuleAddress(Handle *this,string *name)

{
  pointer pcVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  pointer pRVar5;
  vector<remote::Region,_std::allocator<remote::Region>_> regions;
  Region reg;
  vector<remote::Region,_std::allocator<remote::Region>_> local_c0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  size_t local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  bVar3 = IsRunning(this);
  if (bVar3) {
    remote::GetRegions(&local_c0,this->pid);
    if (local_c0.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_c0.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pRVar5 = local_c0.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_78 = pRVar5->inodeFileNumber;
        local_a8 = (undefined4)pRVar5->start;
        uStack_a4 = *(undefined4 *)((long)&pRVar5->start + 4);
        uStack_a0 = (undefined4)pRVar5->end;
        uStack_9c = *(undefined4 *)((long)&pRVar5->end + 4);
        local_98._0_1_ = pRVar5->read;
        local_98._1_1_ = pRVar5->write;
        local_98._2_1_ = pRVar5->exec;
        local_98._3_1_ = pRVar5->shared;
        uStack_94 = *(undefined4 *)&pRVar5->field_0x14;
        uStack_90 = (undefined4)pRVar5->offset;
        uStack_8c = *(undefined4 *)((long)&pRVar5->offset + 4);
        local_88 = (undefined4)pRVar5->deviceMajor;
        uStack_84 = *(undefined4 *)((long)&pRVar5->deviceMajor + 4);
        uStack_80 = (undefined4)pRVar5->deviceMinor;
        uStack_7c = *(undefined4 *)((long)&pRVar5->deviceMinor + 4);
        local_70[0] = local_60;
        pcVar1 = (pRVar5->pathname)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,pcVar1,pcVar1 + (pRVar5->pathname)._M_string_length);
        pcVar1 = (pRVar5->filename)._M_dataplus._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar1,pcVar1 + (pRVar5->filename)._M_string_length);
        iVar4 = std::__cxx11::string::compare((string *)local_50);
        sVar2 = CONCAT44(uStack_a4,local_a8);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0]);
        }
        if (iVar4 == 0) {
          std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector(&local_c0);
          return sVar2;
        }
        pRVar5 = pRVar5 + 1;
      } while (pRVar5 != local_c0.
                         super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl
                         .super__Vector_impl_data._M_finish);
    }
    std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector(&local_c0);
  }
  return 0;
}

Assistant:

size_t Handle::GetModuleAddress(string name) {
    if(IsRunning()) {
        vector<Region> regions = GetRegions();

        // These are ordered by memory start in maps
        // So first result is fine
        for(auto reg : regions) {
            if(reg.filename.compare(name) == 0) {
                return reg.start;
            }
        }
    }

    return 0;
}